

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                   *attr,string *name,uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *v_00;
  ostream *poVar3;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  size_type sVar4;
  const_reference v_01;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n;
  Wrap v_02;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  allocator local_241;
  string local_240;
  string local_220;
  string local_200;
  Wrap local_1dc;
  undefined1 local_1d8 [4];
  Wrap a;
  Animatable<tinyusdz::UsdUVTexture::Wrap> *local_1b8;
  Animatable<tinyusdz::UsdUVTexture::Wrap> *v;
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *attr_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
               __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&v);
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::authored
                    ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                      *)name_local);
  if (bVar1) {
    local_1b8 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
                get_value((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                           *)name_local);
    pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::metas
                       ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                         *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    n = extraout_EDX;
    if (((bVar1) ||
        (bVar1 = Animatable<tinyusdz::UsdUVTexture::Wrap>::has_value(local_1b8), n = extraout_EDX_00
        , bVar1)) ||
       (bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
                is_value_empty((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                                *)name_local), n = extraout_EDX_01, bVar1)) {
      pprint::Indent_abi_cxx11_((string *)local_1d8,(pprint *)(ulong)local_24,n);
      ::std::operator<<(aoStack_1a0,(string *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1d8);
      poVar3 = ::std::operator<<(aoStack_1a0,"token ");
      poVar3 = ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::operator<<(poVar3," = ");
      bVar1 = Animatable<tinyusdz::UsdUVTexture::Wrap>::is_blocked(local_1b8);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0,"None");
      }
      else {
        bVar1 = Animatable<tinyusdz::UsdUVTexture::Wrap>::get_scalar(local_1b8,&local_1dc);
        if (bVar1) {
          to_string_abi_cxx11_(&local_220,(tinyusdz *)(ulong)local_1dc,v_02);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_240,"\"",&local_241);
          quote(&local_200,&local_220,&local_240);
          ::std::operator<<(aoStack_1a0,(string *)&local_200);
          ::std::__cxx11::string::~string((string *)&local_200);
          ::std::__cxx11::string::~string((string *)&local_240);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
          ::std::__cxx11::string::~string((string *)&local_220);
        }
        else {
          ::std::operator<<(aoStack_1a0,"[Animatable: InternalError]");
        }
      }
      pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
               metas((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                      *)name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0," (\n");
        pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
                 metas((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                        *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_268,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_268);
        pprint::Indent_abi_cxx11_(&local_288,(pprint *)(ulong)local_24,n_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_288);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_288);
        ::std::__cxx11::string::~string((string *)&local_268);
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = Animatable<tinyusdz::UsdUVTexture::Wrap>::has_timesamples(local_1b8);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_2a8,(pprint *)(ulong)local_24,n_01);
      ::std::operator<<(aoStack_1a0,(string *)&local_2a8);
      ::std::__cxx11::string::~string((string *)&local_2a8);
      poVar3 = ::std::operator<<(aoStack_1a0,"token ");
      poVar3 = ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::operator<<(poVar3,".timeSamples = ");
      v_00 = Animatable<tinyusdz::UsdUVTexture::Wrap>::get_timesamples(local_1b8);
      print_typed_token_timesamples<tinyusdz::UsdUVTexture::Wrap>(&local_2c8,v_00,local_24);
      ::std::operator<<(aoStack_1a0,(string *)&local_2c8);
      ::std::__cxx11::string::~string((string *)&local_2c8);
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
            has_connections((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                             *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_((string *)&paths,(pprint *)(ulong)local_24,n_02);
      ::std::operator<<(aoStack_1a0,(string *)&paths);
      ::std::__cxx11::string::~string((string *)&paths);
      poVar3 = ::std::operator<<(aoStack_1a0,"token ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
             get_connections((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                              *)name_local);
      sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
      if (sVar4 == 1) {
        v_01 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this,0);
        ::std::operator<<(aoStack_1a0,v_01);
      }
      else {
        sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
        if (sVar4 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&v);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    if (attr.metas().authored() || v.has_value() || attr.is_value_empty()) {
      ss << pprint::Indent(indent);
      ss << "token " << name << " = ";
      if (v.is_blocked()) {
        ss << "None";
      } else {
        T a;
        if (v.get_scalar(&a)) {
          ss << quote(to_string(a));
        } else { 
          ss << "[Animatable: InternalError]";
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {

      ss << pprint::Indent(indent);
      ss << "token " << name << ".timeSamples = ";

      ss << print_typed_token_timesamples(v.get_timesamples(), indent);
      ss << "\n";
    }


    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }


  return ss.str();
}